

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri_wrapper.hpp
# Opt level: O3

void __thiscall jsoncons::jsonschema::uri_wrapper::uri_wrapper(uri_wrapper *this,uri *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  string_view *extraout_RDX;
  string_view *extraout_RDX_00;
  string_view *encoded;
  error_code ec;
  undefined1 local_e8 [40];
  uri local_c0;
  
  (this->uri_).uri_string_._M_dataplus._M_p = (pointer)&(this->uri_).uri_string_.field_2;
  pcVar2 = (uri->uri_string_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (uri->uri_string_)._M_string_length);
  uVar3 = (uri->scheme_part_).second;
  (this->uri_).scheme_part_.first = (uri->scheme_part_).first;
  (this->uri_).scheme_part_.second = uVar3;
  uVar3 = (uri->userinfo_part_).second;
  (this->uri_).userinfo_part_.first = (uri->userinfo_part_).first;
  (this->uri_).userinfo_part_.second = uVar3;
  uVar3 = (uri->host_part_).second;
  (this->uri_).host_part_.first = (uri->host_part_).first;
  (this->uri_).host_part_.second = uVar3;
  uVar3 = (uri->port_part_).second;
  (this->uri_).port_part_.first = (uri->port_part_).first;
  (this->uri_).port_part_.second = uVar3;
  uVar3 = (uri->path_part_).second;
  (this->uri_).path_part_.first = (uri->path_part_).first;
  (this->uri_).path_part_.second = uVar3;
  uVar3 = (uri->query_part_).second;
  (this->uri_).query_part_.first = (uri->query_part_).first;
  (this->uri_).query_part_.second = uVar3;
  uVar4 = *(undefined4 *)((long)&(uri->fragment_part_).first + 4);
  uVar3 = (uri->fragment_part_).second;
  uVar5 = *(undefined4 *)((long)&(uri->fragment_part_).second + 4);
  *(int *)&(this->uri_).fragment_part_.first = (int)(uri->fragment_part_).first;
  *(undefined4 *)((long)&(this->uri_).fragment_part_.first + 4) = uVar4;
  *(int *)&(this->uri_).fragment_part_.second = (int)uVar3;
  *(undefined4 *)((long)&(this->uri_).fragment_part_.second + 4) = uVar5;
  (this->identifier_)._M_dataplus._M_p = (pointer)&(this->identifier_).field_2;
  (this->identifier_)._M_string_length = 0;
  (this->identifier_).field_2._M_local_buf[0] = '\0';
  paVar1 = &local_c0.uri_string_.field_2;
  pcVar2 = (uri->uri_string_)._M_dataplus._M_p;
  local_c0.uri_string_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + (uri->uri_string_)._M_string_length);
  local_c0.scheme_part_.first = (uri->scheme_part_).first;
  local_c0.scheme_part_.second = (uri->scheme_part_).second;
  local_c0.userinfo_part_.first = (uri->userinfo_part_).first;
  local_c0.userinfo_part_.second = (uri->userinfo_part_).second;
  local_c0.host_part_.first = (uri->host_part_).first;
  local_c0.host_part_.second = (uri->host_part_).second;
  local_c0.port_part_.first = (uri->port_part_).first;
  local_c0.port_part_.second = (uri->port_part_).second;
  local_c0.path_part_.first = (uri->path_part_).first;
  local_c0.path_part_.second = (uri->path_part_).second;
  local_c0.query_part_.first = (uri->query_part_).first;
  local_c0.query_part_.second = (uri->query_part_).second;
  local_c0.fragment_part_.first = (uri->fragment_part_).first;
  local_c0.fragment_part_.second = (uri->fragment_part_).second;
  jsoncons::uri::operator=(&this->uri_,&local_c0);
  encoded = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.uri_string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.uri_string_._M_dataplus._M_p,
                    local_c0.uri_string_.field_2._M_allocated_capacity + 1);
    encoded = extraout_RDX_00;
  }
  uVar3 = (this->uri_).fragment_part_.first;
  local_e8._0_8_ = (this->uri_).fragment_part_.second - uVar3;
  if ((pointer)local_e8._0_8_ == (pointer)0x0) {
    this->has_plain_name_fragment_ = false;
  }
  else {
    local_e8._8_8_ = (this->uri_).uri_string_._M_dataplus._M_p + uVar3;
    jsoncons::uri::decode_part_abi_cxx11_(&local_c0.uri_string_,(uri *)local_e8,encoded);
    std::__cxx11::string::operator=((string *)&this->identifier_,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.uri_string_._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.uri_string_._M_dataplus._M_p,
                      local_c0.uri_string_.field_2._M_allocated_capacity + 1);
    }
    local_c0.uri_string_._M_dataplus._M_p =
         local_c0.uri_string_._M_dataplus._M_p & 0xffffffff00000000;
    local_c0.uri_string_._M_string_length = std::_V2::system_category();
    local_e8._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_e8._0_8_ = (this->identifier_)._M_string_length;
    jsonpointer::basic_json_pointer<char>::parse
              ((basic_json_pointer<char> *)(local_e8 + 0x10),(string_view_type *)local_e8,
               (error_code *)&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_e8 + 0x10));
    this->has_plain_name_fragment_ = (int)local_c0.uri_string_._M_dataplus._M_p != 0;
  }
  return;
}

Assistant:

explicit uri_wrapper(const uri& uri)
            : uri_{uri}
        {
            uri_ = jsoncons::uri(uri);
            if (!uri_.encoded_fragment().empty())
            {
                identifier_ = uri_.fragment();
                std::error_code ec;
                jsonpointer::json_pointer::parse(identifier_, ec);
                has_plain_name_fragment_ = ec ? true : false;
            }
            else
            {
                has_plain_name_fragment_ = false;
            }
        }